

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_quantization_transform.cc
# Opt level: O3

bool __thiscall
draco::AttributeQuantizationTransform::ComputeParameters
          (AttributeQuantizationTransform *this,PointAttribute *attribute,int quantization_bits)

{
  float *pfVar1;
  byte bVar2;
  float fVar3;
  pointer pfVar4;
  pointer pfVar5;
  size_t sVar6;
  DataBuffer *pDVar7;
  void *__dest;
  void *__dest_00;
  ulong uVar8;
  void *__src;
  bool bVar9;
  ulong uVar10;
  ulong __n;
  float fVar11;
  float fVar12;
  allocator_type local_69;
  AttributeQuantizationTransform *local_68;
  long local_60;
  ulong local_58;
  value_type_conflict2 local_4c;
  vector<float,_std::allocator<float>_> local_48;
  
  bVar9 = false;
  if ((quantization_bits - 1U < 0x1e) && (bVar9 = false, this->quantization_bits_ == -1)) {
    this->quantization_bits_ = quantization_bits;
    bVar2 = (attribute->super_GeometryAttribute).num_components_;
    __n = (ulong)bVar2;
    this->range_ = 0.0;
    local_4c = 0.0;
    std::vector<float,_std::allocator<float>_>::vector(&local_48,__n,&local_4c,&local_69);
    pfVar4 = (this->min_values_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar5 = (this->min_values_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->min_values_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start;
    (this->min_values_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    (this->min_values_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pfVar4 != (pointer)0x0) {
      operator_delete(pfVar4,(long)pfVar5 - (long)pfVar4);
      if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    uVar10 = (ulong)((uint)bVar2 * 4);
    local_68 = this;
    __dest = operator_new__(uVar10);
    __dest_00 = operator_new__(uVar10);
    sVar6 = (attribute->super_GeometryAttribute).byte_stride_;
    __src = (void *)((long)(((attribute->super_GeometryAttribute).buffer_)->data_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start +
                    (attribute->super_GeometryAttribute).byte_offset_);
    memcpy(__dest_00,__src,sVar6);
    memcpy((local_68->min_values_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start,__src,sVar6);
    local_60 = (attribute->super_GeometryAttribute).byte_offset_;
    pDVar7 = (attribute->super_GeometryAttribute).buffer_;
    sVar6 = (attribute->super_GeometryAttribute).byte_stride_;
    memcpy(__dest,(void *)((long)(pDVar7->data_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + local_60),sVar6);
    local_58 = (ulong)attribute->num_unique_entries_;
    if (1 < local_58) {
      pfVar4 = (local_68->min_values_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_60 = local_60 +
                 (long)(pDVar7->data_).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
      uVar10 = 1;
      do {
        memcpy(__dest_00,(void *)(sVar6 * uVar10 + local_60),sVar6);
        if (__n != 0) {
          uVar8 = 0;
          do {
            fVar11 = *(float *)((long)__dest_00 + uVar8 * 4);
            if (fVar11 < pfVar4[uVar8]) {
              pfVar4[uVar8] = fVar11;
            }
            pfVar1 = (float *)((long)__dest + uVar8 * 4);
            if (*pfVar1 <= fVar11 && fVar11 != *pfVar1) {
              *(float *)((long)__dest + uVar8 * 4) = fVar11;
            }
            uVar8 = uVar8 + 1;
          } while (__n != uVar8);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != local_58);
    }
    if (__n == 0) {
      fVar11 = local_68->range_;
LAB_0015e49e:
      bVar9 = true;
      if ((fVar11 == 0.0) && (!NAN(fVar11))) {
        local_68->range_ = 1.0;
      }
    }
    else {
      pfVar1 = (local_68->min_values_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      fVar3 = *pfVar1;
      if ((uint)ABS(fVar3) < 0x7f800000) {
        fVar11 = local_68->range_;
        uVar10 = 1;
        bVar9 = false;
        do {
          fVar12 = *(float *)((long)__dest + uVar10 * 4 + -4);
          if (0x7f7fffff < (uint)ABS(fVar12)) break;
          fVar12 = fVar12 - fVar3;
          if (fVar11 < fVar12) {
            local_68->range_ = fVar12;
            fVar11 = fVar12;
          }
          if (__n == uVar10) goto LAB_0015e49e;
          bVar9 = __n <= uVar10;
          fVar3 = pfVar1[uVar10];
          uVar10 = uVar10 + 1;
        } while ((uint)ABS(fVar3) < 0x7f800000);
      }
      else {
        bVar9 = false;
      }
    }
    operator_delete__(__dest_00);
    operator_delete__(__dest);
  }
  return bVar9;
}

Assistant:

bool AttributeQuantizationTransform::ComputeParameters(
    const PointAttribute &attribute, const int quantization_bits) {
  if (quantization_bits_ != -1) {
    return false;  // already initialized.
  }
  if (!IsQuantizationValid(quantization_bits)) {
    return false;
  }
  quantization_bits_ = quantization_bits;

  const int num_components = attribute.num_components();
  range_ = 0.f;
  min_values_ = std::vector<float>(num_components, 0.f);
  const std::unique_ptr<float[]> max_values(new float[num_components]);
  const std::unique_ptr<float[]> att_val(new float[num_components]);
  // Compute minimum values and max value difference.
  attribute.GetValue(AttributeValueIndex(0), att_val.get());
  attribute.GetValue(AttributeValueIndex(0), min_values_.data());
  attribute.GetValue(AttributeValueIndex(0), max_values.get());

  for (AttributeValueIndex i(1); i < static_cast<uint32_t>(attribute.size());
       ++i) {
    attribute.GetValue(i, att_val.get());
    for (int c = 0; c < num_components; ++c) {
      if (min_values_[c] > att_val[c]) {
        min_values_[c] = att_val[c];
      }
      if (max_values[c] < att_val[c]) {
        max_values[c] = att_val[c];
      }
    }
  }
  for (int c = 0; c < num_components; ++c) {
    if (std::isnan(min_values_[c]) || std::isinf(min_values_[c]) ||
        std::isnan(max_values[c]) || std::isinf(max_values[c])) {
      return false;
    }
    const float dif = max_values[c] - min_values_[c];
    if (dif > range_) {
      range_ = dif;
    }
  }

  // In case all values are the same, initialize the range to unit length. This
  // will ensure that all values are quantized properly to the same value.
  if (range_ == 0.f) {
    range_ = 1.f;
  }

  return true;
}